

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O1

uint64_t Assimp::FBX::ParseTokenAsID(Token *t,char **err_out)

{
  uint64_t uVar1;
  char *pcVar2;
  uint *in_RCX;
  uint length;
  char *out;
  int local_24;
  char *local_20;
  
  *err_out = (char *)0x0;
  if (t->type == TokenType_DATA) {
    if (t->column == 0xffffffff) {
      if (*t->sbegin == 'L') {
        return *(uint64_t *)(t->sbegin + 1);
      }
      pcVar2 = "failed to parse ID, unexpected data type, expected L(ong) (binary)";
    }
    else {
      local_24 = *(int *)&t->send - (int)(Assimp *)t->sbegin;
      local_20 = (char *)0x0;
      uVar1 = strtoul10_64((Assimp *)t->sbegin,(char *)&local_20,(char **)&local_24,in_RCX);
      if (local_20 <= t->send) {
        return uVar1;
      }
      pcVar2 = "failed to parse ID (text)";
    }
  }
  else {
    pcVar2 = "expected TOK_DATA token";
  }
  *err_out = pcVar2;
  return 0;
}

Assistant:

uint64_t ParseTokenAsID(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return 0L;
    }

    if(t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'L') {
            err_out = "failed to parse ID, unexpected data type, expected L(ong) (binary)";
            return 0L;
        }

        BE_NCONST uint64_t id = SafeParse<uint64_t>(data+1, t.end());
        AI_SWAP8(id);
        return id;
    }

    // XXX: should use size_t here
    unsigned int length = static_cast<unsigned int>(t.end() - t.begin());
    ai_assert(length > 0);

    const char* out = nullptr;
    const uint64_t id = strtoul10_64(t.begin(),&out,&length);
    if (out > t.end()) {
        err_out = "failed to parse ID (text)";
        return 0L;
    }

    return id;
}